

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::render
          (RecreateBuffersTest *this,Context *ctx,Surface *dst)

{
  TextureFormatInfo *__return_storage_ptr__;
  float outputType;
  TextureFormat TVar1;
  DataType type_00;
  deUint32 dVar2;
  deUint32 program;
  deUint32 program_00;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  DataTypes *pDVar6;
  FboConfig *pFVar7;
  uint local_7c0;
  GLenum local_7ac;
  deUint32 local_7a0;
  deUint32 local_79c;
  deUint32 local_798;
  deUint32 local_794;
  deUint32 local_788;
  GLenum local_774;
  GLenum local_75c;
  Vector<float,_3> local_6d0;
  Vector<float,_3> local_6c4;
  Vector<float,_3> local_6b8;
  Vector<float,_3> local_6ac;
  Vector<float,_3> local_6a0;
  Vector<float,_3> local_694;
  uint local_688;
  GLenum local_684;
  deUint32 buf_1;
  deUint32 type_1;
  deUint32 point;
  deUint32 bit_1;
  int ndx_1;
  deUint32 buf;
  deUint32 format;
  deUint32 type;
  deUint32 bit;
  int ndx;
  Vector<float,_3> local_654;
  Vector<float,_4> local_648;
  Vector<float,_4> local_638;
  Vector<float,_4> local_628;
  Vec4 local_618;
  undefined1 local_608 [8];
  Framebuffer fbo;
  bool stencil;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  int height;
  int width;
  deUint32 flatShaderID;
  deUint32 texFromFboShaderID;
  deUint32 texToFboShaderID;
  FlatColorShader flatShader;
  Vector<float,_4> local_448;
  DataTypes local_438;
  undefined1 local_420 [8];
  Texture2DShader texFromFboShader;
  Vector<float,_4> local_274;
  DataTypes local_258;
  undefined1 local_238 [8];
  Texture2DShader texToFboShader;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  DataType fboOutputType;
  TextureFormat TStack_28;
  DataType fboSamplerType;
  TextureFormat colorFormat;
  Surface *dst_local;
  Context *ctx_local;
  RecreateBuffersTest *this_local;
  
  colorFormat = (TextureFormat)dst;
  register0x00000000 = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  TStack_28 = register0x00000000;
  type_00 = glu::getSampler2DType(register0x00000000);
  fboRangeInfo.lookupBias.m_data[2] =
       (float)FboTestUtil::getFragmentOutputType(&stack0xffffffffffffffd8);
  __return_storage_ptr__ = (TextureFormatInfo *)(fboOutScale.m_data + 2);
  tcu::getTextureFormatInfo(__return_storage_ptr__,&stack0xffffffffffffffd8);
  tcu::operator-((tcu *)(fboOutBias.m_data + 2),
                 (Vector<float,_4> *)(fboRangeInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)__return_storage_ptr__);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&texToFboShader.field_0x194,
             (Vector<float,_4> *)__return_storage_ptr__);
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_258);
  pDVar6 = FboTestUtil::DataTypes::operator<<(&local_258,TYPE_SAMPLER_2D);
  outputType = fboRangeInfo.lookupBias.m_data[2];
  tcu::Vector<float,_4>::Vector(&local_274,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texFromFboShader.field_0x194,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_238,pDVar6,(DataType)outputType,&local_274,
             (Vec4 *)&texFromFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_258);
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_438);
  pDVar6 = FboTestUtil::DataTypes::operator<<(&local_438,type_00);
  tcu::Vector<float,_4>::Vector(&local_448,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&flatShader.super_ShaderProgram.m_hasGeometryShader,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_420,pDVar6,TYPE_FLOAT_VEC4,&local_448,
             (Vec4 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  FboTestUtil::DataTypes::~DataTypes(&local_438);
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)&texFromFboShaderID,(DataType)fboRangeInfo.lookupBias.m_data[2]);
  dVar2 = (*ctx->_vptr_Context[0x75])(ctx,local_238);
  program = (*ctx->_vptr_Context[0x75])(ctx,local_420);
  program_00 = (*ctx->_vptr_Context[0x75])(ctx,&texFromFboShaderID);
  fbo._52_4_ = 2;
  fbo.m_depthStencilBuffer._3_1_ = (byte)((this->super_FboRenderCase).m_config.buffers >> 10) & 1;
  createQuadsTex2D(ctx,2,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(ctx,1,0x1907,0x1401,0x40,0x40);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_608,ctx,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_608);
  FboTestUtil::Texture2DShader::setOutScaleBias
            ((Texture2DShader *)local_238,(Vec4 *)(fboOutBias.m_data + 2),
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_420,0,(Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
             (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_238,ctx,dVar2);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_420,ctx,program);
  tcu::Vector<float,_4>::Vector(&local_638,0.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_628,&local_638,(Vector<float,_4> *)(fboOutBias.m_data + 2));
  tcu::operator+((tcu *)&local_618,&local_628,(Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)&texFromFboShaderID,ctx,program_00,&local_618);
  dVar3 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_608);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar3);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  tcu::Vector<float,_4>::Vector(&local_648,1.0,0.0,0.0,1.0);
  FboTestUtil::clearColorBuffer(ctx,&stack0xffffffffffffffd8,&local_648);
  (*ctx->_vptr_Context[0x2d])(ctx,0x500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)(uint)fbo._52_4_);
  tcu::Vector<float,_3>::Vector(&local_654,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&bit,1.0,1.0,0.0);
  sglr::drawQuad(ctx,dVar2,&local_654,(Vec3 *)&bit);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if ((fbo.m_depthStencilBuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if ((this->m_rebind & 1U) == 0) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  for (type = 0; (int)type < 2; type = type + 1) {
    format = 0x500;
    if (type == 0) {
      format = 0x4000;
      pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
      local_75c = pFVar7->colorType;
    }
    else {
      pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
      local_75c = pFVar7->depthStencilType;
    }
    buf = local_75c;
    if (type == 0) {
      pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
      local_774 = pFVar7->colorFormat;
    }
    else {
      pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
      local_774 = pFVar7->depthStencilFormat;
    }
    ndx_1 = local_774;
    if (type == 0) {
      local_788 = Functional::Framebuffer::getColorBuffer((Framebuffer *)local_608);
    }
    else {
      local_788 = Functional::Framebuffer::getDepthStencilBuffer((Framebuffer *)local_608);
    }
    bit_1 = local_788;
    if ((this->m_buffers & format) != 0) {
      if (buf == 0xde1) {
        (*ctx->_vptr_Context[8])(ctx,1,&bit_1);
        (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)bit_1);
        (*ctx->_vptr_Context[0x7e])(ctx,0xde1,0,(ulong)(uint)ndx_1,0x80);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
      }
      else if (buf == 0x8d41) {
        (*ctx->_vptr_Context[0xe])(ctx,1,&bit_1);
        (*ctx->_vptr_Context[0xc])(ctx,0x8d41,(ulong)bit_1);
        (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)(uint)ndx_1,0x80,0x80);
      }
    }
  }
  if ((this->m_rebind & 1U) != 0) {
    for (point = 0; (int)point < 3; point = point + 1) {
      if (point == 0) {
        local_794 = 0x4000;
      }
      else {
        if (point == 1) {
          local_798 = 0x100;
        }
        else {
          local_798 = 0;
          if (point == 2) {
            local_798 = 0x400;
          }
        }
        local_794 = local_798;
      }
      type_1 = local_794;
      if (point == 0) {
        local_79c = 0x8ce0;
      }
      else {
        if (point == 1) {
          local_7a0 = 0x8d00;
        }
        else {
          local_7a0 = 0;
          if (point == 2) {
            local_7a0 = 0x8d20;
          }
        }
        local_79c = local_7a0;
      }
      buf_1 = local_79c;
      if (point == 0) {
        pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
        local_7ac = pFVar7->colorType;
      }
      else {
        pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
        local_7ac = pFVar7->depthStencilType;
      }
      local_684 = local_7ac;
      if (point == 0) {
        local_7c0 = Functional::Framebuffer::getColorBuffer((Framebuffer *)local_608);
      }
      else {
        local_7c0 = Functional::Framebuffer::getDepthStencilBuffer((Framebuffer *)local_608);
      }
      local_688 = local_7c0;
      if ((this->m_buffers & type_1) != 0) {
        if (local_684 == 0xde1) {
          (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,(ulong)buf_1,0xde1,(ulong)local_7c0,0);
        }
        else if (local_684 == 0x8d41) {
          (*ctx->_vptr_Context[0x20])(ctx,0x8d40,(ulong)buf_1,0x8d41,(ulong)local_7c0);
        }
      }
    }
  }
  if ((this->m_rebind & 1U) == 0) {
    dVar3 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_608);
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)dVar3);
  }
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,(ulong)(this->m_buffers & 0x500));
  if ((this->m_buffers & 0x4000) != 0) {
    tcu::Vector<float,_3>::Vector(&local_694,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_6a0,1.0,1.0,0.0);
    sglr::drawQuad(ctx,program_00,&local_694,&local_6a0);
  }
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  if ((fbo.m_depthStencilBuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  tcu::Vector<float,_3>::Vector(&local_6ac,-1.0,-1.0,1.0);
  tcu::Vector<float,_3>::Vector(&local_6b8,1.0,1.0,-1.0);
  sglr::drawQuad(ctx,dVar2,&local_6ac,&local_6b8);
  if ((fbo.m_depthStencilBuffer._3_1_ & 1) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_608);
  if (pFVar7->colorType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    dVar2 = Functional::Framebuffer::getColorBuffer((Framebuffer *)local_608);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)dVar2);
    uVar4 = (*ctx->_vptr_Context[2])();
    uVar5 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar4,(ulong)uVar5);
    tcu::Vector<float,_3>::Vector(&local_6c4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_6d0,1.0,1.0,0.0);
    sglr::drawQuad(ctx,program,&local_6c4,&local_6d0);
    TVar1 = colorFormat;
    uVar4 = (*ctx->_vptr_Context[2])();
    uVar5 = (*ctx->_vptr_Context[3])();
    (*ctx->_vptr_Context[0x80])(ctx,TVar1,0,0,(ulong)uVar4,(ulong)uVar5);
  }
  else {
    FboTestUtil::readPixels
              (ctx,(Surface *)colorFormat,0,0,0x80,0x80,&stack0xffffffffffffffd8,
               (Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
               (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_608);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&texFromFboShaderID);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_420);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_238);
  return;
}

Assistant:

void RecreateBuffersTest::render (sglr::Context& ctx, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= ctx.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= ctx.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= ctx.createProgram(&flatShader);

	int						width				= 128;
	int						height				= 128;
	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, m_config, width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	texToFboShader.setUniforms	(ctx, texToFboShaderID);
	texFromFboShader.setUniforms(ctx, texFromFboShaderID);
	flatShader.setColor			(ctx, flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f) * fboOutScale + fboOutBias);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	clearColorBuffer(ctx, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	ctx.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	DE_ASSERT((m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == 0 ||
			  (m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)));

	// Recreate.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT
									   : (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
									   : fbo.getConfig().depthStencilType;
		deUint32	format	= ndx == 0 ? fbo.getConfig().colorFormat
									   : fbo.getConfig().depthStencilFormat;
		deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
									   : fbo.getDepthStencilBuffer();

		if ((m_buffers & bit) == 0)
			continue;

		switch (type)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &buf);
				ctx.bindTexture(GL_TEXTURE_2D, buf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, format, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &buf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, buf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Rebind.
	if (m_rebind)
	{
		for (int ndx = 0; ndx < 3; ndx++)
		{
			deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT	:
								  ndx == 1 ? GL_DEPTH_BUFFER_BIT	:
								  ndx == 2 ? GL_STENCIL_BUFFER_BIT	: 0;
			deUint32	point	= ndx == 0 ? GL_COLOR_ATTACHMENT0	:
								  ndx == 1 ? GL_DEPTH_ATTACHMENT	:
								  ndx == 2 ? GL_STENCIL_ATTACHMENT	: 0;
			deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
										   : fbo.getConfig().depthStencilType;
			deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
										   : fbo.getDepthStencilBuffer();

			if ((m_buffers & bit) == 0)
				continue;

			switch (type)
			{
				case GL_TEXTURE_2D:
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, buf, 0);
					break;

				case GL_RENDERBUFFER:
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, buf);
					break;

				default:
					DE_ASSERT(false);
			}
		}
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearStencil(0);
	ctx.clear(m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)); // \note Clear only buffers that were re-created
	if (m_buffers & GL_COLOR_BUFFER_BIT)
	{
		// Clearing of integer buffers is undefined so do clearing by rendering flat color.
		sglr::drawQuad(ctx, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	}

	ctx.enable(GL_DEPTH_TEST);

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		readPixels(ctx, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	}
}